

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

FArchive * SerializeFFontPtr(FArchive *arc,FFont **font)

{
  bool bVar1;
  FFont *pFVar2;
  char *local_20;
  char *name;
  FFont **font_local;
  FArchive *arc_local;
  
  name = (char *)font;
  font_local = (FFont **)arc;
  bVar1 = FArchive::IsStoring(arc);
  if (bVar1) {
    FArchive::operator<<((FArchive *)font_local,(char **)(*(long *)name + 0x50));
  }
  else {
    local_20 = (char *)0x0;
    FArchive::operator<<((FArchive *)font_local,&local_20);
    pFVar2 = V_GetFont(local_20);
    *(FFont **)name = pFVar2;
    if (*(long *)name == 0) {
      Printf("Could not load font %s\n",local_20);
      *(FFont **)name = SmallFont;
    }
    if (local_20 != (char *)0x0) {
      operator_delete__(local_20);
    }
  }
  return (FArchive *)font_local;
}

Assistant:

FArchive &SerializeFFontPtr (FArchive &arc, FFont* &font)
{
	if (arc.IsStoring ())
	{
		arc << font->Name;
	}
	else
	{
		char *name = NULL;

		arc << name;
		font = V_GetFont(name);
		if (font == NULL)
		{
			Printf ("Could not load font %s\n", name);
			font = SmallFont;
		}
		delete[] name;
	}
	return arc;
}